

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O2

bool __thiscall
cappuccino::
tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::insert(tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
         *this,milliseconds ttl,unsigned_long *key,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,allow a)

{
  bool bVar1;
  time_point now;
  
  now.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  std::mutex::lock((mutex *)this);
  bVar1 = do_insert_update(this,key,value,now,(time_point)(ttl.__r * 1000000 + (long)now.__d.__r),a)
  ;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return bVar1;
}

Assistant:

auto insert(std::chrono::milliseconds ttl, const key_type& key, value_type value, allow a = allow::insert_or_update)
        -> bool
    {
        auto now         = std::chrono::steady_clock::now();
        auto expire_time = now + ttl;

        std::lock_guard guard{m_lock};
        return do_insert_update(key, std::move(value), now, expire_time, a);
    }